

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vta_Obj_t * Vga_ManFindOrAdd(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vta_Obj_t *pVVar4;
  int *piVar5;
  Vta_Obj_t *pVVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  size_t __size;
  long lVar11;
  ulong uVar12;
  
  if ((iObj < 0) || (iFrame < -1)) {
    __assert_fail("iObj >= 0 && iFrame >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                  ,0x125,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
  }
  if (p->nObjs == p->nObjsAlloc) {
    __size = (long)p->nObjsAlloc << 5;
    if (p->pObjs == (Vta_Obj_t *)0x0) {
      pVVar4 = (Vta_Obj_t *)malloc(__size);
    }
    else {
      pVVar4 = (Vta_Obj_t *)realloc(p->pObjs,__size);
    }
    p->pObjs = pVVar4;
    iVar10 = p->nObjsAlloc;
    memset(pVVar4 + iVar10,0,(long)iVar10 * 0x10);
    p->nObjsAlloc = iVar10 * 2;
    if (p->pBins != (int *)0x0) {
      free(p->pBins);
      p->pBins = (int *)0x0;
    }
    uVar8 = p->nBins * 2 - 1;
    while( true ) {
      do {
        uVar7 = uVar8 + 1;
        uVar3 = uVar8 & 1;
        uVar8 = uVar7;
      } while (uVar3 != 0);
      if (uVar7 < 9) break;
      iVar10 = 5;
      while (uVar7 % (iVar10 - 2U) != 0) {
        uVar3 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar7 < uVar3) goto LAB_006225a0;
      }
    }
LAB_006225a0:
    p->nBins = uVar7;
    piVar5 = (int *)calloc((long)(int)uVar7,4);
    p->pBins = piVar5;
    uVar12 = (ulong)(uint)p->nObjs;
    if (1 < p->nObjs) {
      pVVar4 = p->pObjs;
      lVar11 = 1;
      do {
        pVVar4[lVar11].iNext = 0;
        iVar10 = pVVar4[lVar11].iObj;
        iVar1 = pVVar4[lVar11].iFrame;
        uVar8 = (uint)((iVar1 + iVar10 + 1) * (iVar1 + iVar10)) % (uint)p->nBins;
        iVar2 = piVar5[(int)uVar8];
        if (((long)iVar2 < 0) || ((int)uVar12 <= iVar2)) goto LAB_00622758;
        piVar9 = piVar5 + (int)uVar8;
        if (iVar2 != 0 && pVVar4 != (Vta_Obj_t *)0x0) {
          pVVar6 = pVVar4 + iVar2;
          do {
            if ((pVVar6->iObj == iVar10) && (pVVar6->iFrame == iVar1)) break;
            iVar2 = pVVar6->iNext;
            if (((long)iVar2 < 0) || ((int)uVar12 <= iVar2)) goto LAB_00622758;
            piVar9 = &pVVar6->iNext;
            pVVar6 = (Vta_Obj_t *)0x0;
            if (iVar2 != 0) {
              pVVar6 = pVVar4 + iVar2;
            }
          } while (pVVar6 != (Vta_Obj_t *)0x0);
        }
        if (*piVar9 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x134,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
        }
        *piVar9 = (int)lVar11;
        lVar11 = lVar11 + 1;
        uVar12 = (ulong)p->nObjs;
      } while (lVar11 < (long)uVar12);
    }
  }
  uVar8 = (uint)((iFrame + iObj + 1) * (iFrame + iObj)) % (uint)p->nBins;
  iVar10 = p->pBins[(int)uVar8];
  if (-1 < (long)iVar10) {
    uVar3 = p->nObjs;
    if (iVar10 < (int)uVar3) {
      if (iVar10 == 0) {
        pVVar4 = (Vta_Obj_t *)0x0;
      }
      else {
        pVVar4 = p->pObjs + iVar10;
      }
      piVar5 = p->pBins + (int)uVar8;
      while ((pVVar4 != (Vta_Obj_t *)0x0 && ((pVVar4->iObj != iObj || (pVVar4->iFrame != iFrame)))))
      {
        iVar10 = pVVar4->iNext;
        if (((long)iVar10 < 0) || ((int)uVar3 <= iVar10)) goto LAB_00622758;
        if (iVar10 == 0) {
          pVVar6 = (Vta_Obj_t *)0x0;
        }
        else {
          pVVar6 = p->pObjs + iVar10;
        }
        piVar5 = &pVVar4->iNext;
        pVVar4 = pVVar6;
      }
      uVar8 = *piVar5;
      if ((ulong)uVar8 == 0) {
        p->nObjs = uVar3 + 1;
        *piVar5 = uVar3;
        if ((-1 < (int)uVar3) && ((int)uVar3 < p->nObjs)) {
          pVVar4 = p->pObjs;
          pVVar4[uVar3].iObj = iObj;
          pVVar4[uVar3].iFrame = iFrame;
          return pVVar4 + uVar3;
        }
      }
      else if ((-1 < (int)uVar8) && ((int)uVar8 < (int)uVar3)) {
        return p->pObjs + uVar8;
      }
    }
  }
LAB_00622758:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
}

Assistant:

static inline Vta_Obj_t * Vga_ManFindOrAdd( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int i, * pPlace;
    assert( iObj >= 0 && iFrame >= -1 );
    if ( p->nObjs == p->nObjsAlloc )
    {
        // resize objects
        p->pObjs = ABC_REALLOC( Vta_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, p->nObjsAlloc * sizeof(Vta_Obj_t) );
        p->nObjsAlloc *= 2;
        // rehash entries in the table
        ABC_FREE( p->pBins );
        p->nBins = Abc_PrimeCudd( 2 * p->nBins );
        p->pBins = ABC_CALLOC( int, p->nBins );
        Vta_ManForEachObj( p, pThis, i )
        {
            pThis->iNext = 0;
            pPlace = Vga_ManLookup( p, pThis->iObj, pThis->iFrame );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Vga_ManLookup( p, iObj, iFrame );
    if ( *pPlace )
        return Vta_ManObj(p, *pPlace);
    *pPlace = p->nObjs++;
    pThis = Vta_ManObj(p, *pPlace);
    pThis->iObj   = iObj;
    pThis->iFrame = iFrame;
    return pThis;
}